

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_destroy_v2(opj_t1_t *p_t1)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    mqc_destroy((opj_mqc_t *)0x16231e);
    *(undefined8 *)((long)in_RDI + 8) = 0;
    raw_destroy((opj_raw_t *)0x162337);
    *(undefined8 *)((long)in_RDI + 0x10) = 0;
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      free(*(void **)((long)in_RDI + 0x18));
      *(undefined8 *)((long)in_RDI + 0x18) = 0;
    }
    if (*(long *)((long)in_RDI + 0x20) != 0) {
      free(*(void **)((long)in_RDI + 0x20));
      *(undefined8 *)((long)in_RDI + 0x20) = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void t1_destroy_v2(opj_t1_t *p_t1)
{
	if
		(! p_t1)
	{
		return;
	}

	/* destroy MQC and RAW handles */
	mqc_destroy(p_t1->mqc);
	p_t1->mqc = 00;
	raw_destroy(p_t1->raw);
	p_t1->raw = 00;
	if
		(p_t1->data)
	{
		opj_aligned_free(p_t1->data);
		p_t1->data = 00;
	}
	if
		(p_t1->flags)
	{
		opj_aligned_free(p_t1->flags);
		p_t1->flags = 00;
	}
	opj_free(p_t1);
}